

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O0

void * __thiscall LdConfigDirWrapper::firstSubEntryPtr(LdConfigDirWrapper *this,size_t parentId)

{
  Executable *pEVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  size_t sVar5;
  undefined4 extraout_var;
  char *ptr;
  bufsize_t handlerSize;
  addr_type aT;
  offset_t offset;
  size_t sStack_20;
  bool isOk;
  size_t parentId_local;
  LdConfigDirWrapper *this_local;
  
  offset._7_1_ = 0;
  sStack_20 = parentId;
  parentId_local = (size_t)this;
  uVar4 = ExeElementWrapper::getNumValue
                    ((ExeElementWrapper *)this,parentId,(bool *)((long)&offset + 7));
  if ((offset._7_1_ & 1) == 0) {
    this_local = (LdConfigDirWrapper *)0x0;
  }
  else {
    uVar2 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1a])
                      (this,sStack_20,0xffffffffffffffff);
    if (uVar2 == 0) {
      this_local = (LdConfigDirWrapper *)0x0;
    }
    else {
      sVar5 = firstSubEntrySize(this,sStack_20);
      pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar1,uVar4,(ulong)uVar2,sVar5,0);
      this_local = (LdConfigDirWrapper *)CONCAT44(extraout_var,iVar3);
      if (this_local == (LdConfigDirWrapper *)0x0) {
        this_local = (LdConfigDirWrapper *)0x0;
      }
    }
  }
  return this_local;
}

Assistant:

void* LdConfigDirWrapper::firstSubEntryPtr(size_t parentId)
{
    bool isOk = false;
    offset_t offset = this->getNumValue(parentId, &isOk);
    if (!isOk) return NULL;

    Executable::addr_type aT = containsAddrType(parentId);
    if (aT == Executable::NOT_ADDR) return NULL;

    bufsize_t handlerSize = static_cast<bufsize_t>(this->firstSubEntrySize(parentId));
    char *ptr = (char*) m_Exe->getContentAt(offset, aT, handlerSize);
    if (!ptr) return NULL;

    return ptr;
}